

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

void apx_file_calc_file_type(apx_file_t *self)

{
  _Bool _Var1;
  apx_file_t *self_local;
  
  _Var1 = rmf_fileInfo_name_ends_with(&self->file_info,".apx");
  if (_Var1) {
    self->apx_file_type = '\x01';
  }
  else {
    _Var1 = rmf_fileInfo_name_ends_with(&self->file_info,".out");
    if (_Var1) {
      self->apx_file_type = '\x02';
    }
    else {
      _Var1 = rmf_fileInfo_name_ends_with(&self->file_info,".in");
      if (_Var1) {
        self->apx_file_type = '\x03';
      }
      else {
        _Var1 = rmf_fileInfo_name_ends_with(&self->file_info,".cout");
        if (_Var1) {
          self->apx_file_type = '\x04';
        }
        else {
          _Var1 = rmf_fileInfo_name_ends_with(&self->file_info,".cin");
          if (_Var1) {
            self->apx_file_type = '\x05';
          }
          else {
            self->apx_file_type = '\0';
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void apx_file_calc_file_type(apx_file_t *self)
{
   if (rmf_fileInfo_name_ends_with(&self->file_info, APX_DEFINITION_FILE_EXT))
   {
      self->apx_file_type = APX_DEFINITION_FILE_TYPE;
   }
   else if (rmf_fileInfo_name_ends_with(&self->file_info, APX_PROVIDE_PORT_DATA_EXT))
   {
      self->apx_file_type = APX_PROVIDE_PORT_DATA_FILE_TYPE;
   }
   else if (rmf_fileInfo_name_ends_with(&self->file_info, APX_REQUIRE_PORT_DATA_EXT))
   {
      self->apx_file_type = APX_REQUIRE_PORT_DATA_FILE_TYPE;
   }
   else if (rmf_fileInfo_name_ends_with(&self->file_info, APX_PROVIDE_PORT_COUNT_EXT))
   {
      self->apx_file_type = APX_PROVIDE_PORT_COUNT_FILE_TYPE;
   }
   else if (rmf_fileInfo_name_ends_with(&self->file_info, APX_REQUIRE_PORT_COUNT_EXT))
   {
      self->apx_file_type = APX_REQUIRE_PORT_COUNT_FILE_TYPE;
   }
   else
   {
      self->apx_file_type = APX_UNKNOWN_FILE_TYPE;
   }
}